

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirit2_playground.cpp
# Opt level: O2

void __thiscall client::mini_xml_printer::operator()(mini_xml_printer *this,mini_xml *xml)

{
  pointer pvVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  pointer this_00;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  tab(this->indent);
  poVar2 = std::operator<<((ostream *)&std::cout,"tag: ");
  poVar2 = std::operator<<(poVar2,(string *)xml);
  std::endl<char,std::char_traits<char>>(poVar2);
  tab(this->indent);
  poVar2 = std::operator<<((ostream *)&std::cout,'{');
  std::endl<char,std::char_traits<char>>(poVar2);
  pvVar1 = (xml->children).
           super__Vector_base<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (xml->children).
                 super__Vector_base<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pvVar1; this_00 = this_00 + 1
      ) {
    uStack_28 = CONCAT44(this->indent,(undefined4)uStack_28);
    boost::variant<boost::recursive_wrapper<client::mini_xml>,std::__cxx11::string>::
    apply_visitor<client::mini_xml_node_printer_const>
              ((variant<boost::recursive_wrapper<client::mini_xml>,std::__cxx11::string> *)this_00,
               (mini_xml_node_printer *)((long)&uStack_28 + 4));
  }
  tab(this->indent);
  poVar2 = std::operator<<((ostream *)&std::cout,'}');
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void mini_xml_printer::operator()(mini_xml const& xml) const
    {
        tab(indent);
        std::cout << "tag: " << xml.name << std::endl;
        tab(indent);
        std::cout << '{' << std::endl;

        BOOST_FOREACH(mini_xml_node const& node, xml.children)
        {
            boost::apply_visitor(mini_xml_node_printer(indent), node);
        }

        tab(indent);
        std::cout << '}' << std::endl;
    }